

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::removeStaleSimpleKeyCandidates(Scanner *this)

{
  iterator pSVar1;
  iterator pSVar2;
  pointer pTVar3;
  iterator Position;
  Twine local_30;
  iterator local_18;
  iterator i;
  Scanner *this_local;
  
  i = (iterator)this;
  local_18 = SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>::begin
                       ((SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void> *)
                        &this->SimpleKeys);
  while (pSVar1 = local_18,
        pSVar2 = SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>::end
                           ((SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void> *)
                            &this->SimpleKeys), pSVar1 != pSVar2) {
    if ((local_18->Line == this->Line) && (this->Column <= local_18->Column + 0x400)) {
      local_18 = local_18 + 1;
    }
    else {
      if ((local_18->IsRequired & 1U) != 0) {
        Twine::Twine(&local_30,"Could not find expected : for simple key");
        pTVar3 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                 ::
                 IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>
                 ::operator->(&local_18->Tok);
        Position = StringRef::begin(&pTVar3->Range);
        setError(this,&local_30,Position);
      }
      local_18 = SmallVectorImpl<(anonymous_namespace)::SimpleKey>::erase
                           (&(this->SimpleKeys).
                             super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>,local_18);
    }
  }
  return;
}

Assistant:

void Scanner::removeStaleSimpleKeyCandidates() {
  for (SmallVectorImpl<SimpleKey>::iterator i = SimpleKeys.begin();
                                            i != SimpleKeys.end();) {
    if (i->Line != Line || i->Column + 1024 < Column) {
      if (i->IsRequired)
        setError( "Could not find expected : for simple key"
                , i->Tok->Range.begin());
      i = SimpleKeys.erase(i);
    } else
      ++i;
  }
}